

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O2

shared_ptr<cppcms::rpc::json_call> __thiscall
cppcms::rpc::json_rpc_server::release_call(json_rpc_server *this)

{
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  json_rpc_server *in_RSI;
  shared_ptr<cppcms::rpc::json_call> sVar1;
  __shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  check_call(in_RSI);
  this_00 = (in_RSI->current_call_).
            super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  application::release_context((application *)&_Stack_38);
  std::__shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2> *)this_00,&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  std::__shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2> *)this,
             &(in_RSI->current_call_).
              super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(in_RSI->current_call_).
              super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>);
  sVar1.super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppcms::rpc::json_call>)
         sVar1.super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<json_call> json_rpc_server::release_call()
	{
		check_call();
		current_call_->attach_context(release_context());
		booster::shared_ptr<json_call> call = current_call_;
		current_call_.reset();
		return call;
	}